

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O3

char * duckdb_snappy::internal::CompressFragmentDoubleHash
                 (char *input,size_t input_size,char *op,uint16_t *table,int table_size,
                 uint16_t *table2,int table_size2)

{
  long *plVar1;
  long *plVar2;
  ushort uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  long *plVar7;
  ulong uVar8;
  byte bVar9;
  short sVar10;
  uint uVar11;
  uint32_t u;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  short sVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  char *pcVar19;
  ulong uVar20;
  int iVar21;
  uint uVar22;
  long *plVar23;
  uint64_t x;
  char *pcVar24;
  uint *puVar25;
  long *plVar26;
  long *__src;
  
  plVar2 = (long *)(input + input_size);
  iVar4 = (int)plVar2;
  __src = (long *)input;
  if (input_size < 0xf) {
LAB_00236c7f:
    if (__src < plVar2) {
      iVar4 = iVar4 - (int)__src;
      uVar14 = iVar4 - 1;
      if (iVar4 < 0x3d) {
        bVar9 = (char)uVar14 << 2;
        puVar25 = (uint *)op;
      }
      else {
        uVar22 = 0x1f;
        if (uVar14 != 0) {
          for (; uVar14 >> uVar22 == 0; uVar22 = uVar22 - 1) {
          }
        }
        uVar22 = (uVar22 ^ 0x18) >> 3 ^ 3;
        *(uint *)((long)op + 1) = uVar14;
        bVar9 = (char)uVar22 * '\x04' | 0xf0;
        puVar25 = (uint *)((long)op + (ulong)uVar22 + 1);
      }
      *op = bVar9;
      switchD_00332694::default((void *)((long)puVar25 + 1),__src,(long)iVar4);
      op = (char *)((long)puVar25 + (long)iVar4 + 1U);
    }
    return (char *)(uint *)op;
  }
  uVar14 = table_size * 2 - 2;
  plVar1 = plVar2 + -1;
LAB_002365d6:
  uVar16 = 0x200;
  plVar23 = (long *)((long)__src + 1);
  do {
    plVar26 = plVar23;
    plVar23 = (long *)((uVar16 >> 9) + (long)plVar26);
    if ((long *)((long)plVar2 - 0xfU) < plVar23) goto LAB_00236c7f;
    lVar17 = *plVar26;
    uVar13 = (ulong)((uint)((ulong)(lVar17 * 0xcf1bbcdcbfa563) >> 0x31) & uVar14);
    uVar20 = (ulong)*(ushort *)(uVar13 + (long)table2);
    sVar10 = (short)plVar26 - (short)input;
    *(short *)(uVar13 + (long)table2) = sVar10;
    iVar21 = (int)lVar17;
    if (*(int *)(input + uVar20) == iVar21) {
      plVar23 = (long *)((long)plVar26 + 4);
      uVar16 = 0;
      if (plVar1 < plVar23) goto LAB_00236707;
      uVar16 = 0;
      goto LAB_002366e4;
    }
    uVar13 = (ulong)((uint)(iVar21 * -0x61c8864f) >> 0x11 & uVar14);
    uVar20 = (ulong)*(ushort *)(uVar13 + (long)table);
    *(short *)(uVar13 + (long)table) = sVar10;
    uVar16 = (ulong)((int)uVar16 + 1);
  } while (*(int *)(input + uVar20) != iVar21);
  plVar23 = (long *)((long)plVar26 + 4);
  uVar16 = 0;
  if (plVar23 <= plVar1) {
    uVar16 = 0;
LAB_0023665a:
    if (*(ulong *)((long)plVar23 + uVar16) == *(ulong *)(input + uVar16 + uVar20 + 4))
    goto code_r0x0023666c;
    uVar18 = *(ulong *)(input + uVar16 + uVar20 + 4) ^ *(ulong *)((long)plVar23 + uVar16);
    uVar13 = 0;
    if (uVar18 != 0) {
      for (; (uVar18 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
      }
    }
    iVar21 = (int)uVar16 + ((uint)(uVar13 >> 3) & 0x1fffffff);
    goto LAB_0023676a;
  }
  goto LAB_00236682;
LAB_002366e4:
  if (*(ulong *)((long)plVar23 + uVar16) == *(ulong *)(input + uVar16 + uVar20 + 4))
  goto code_r0x002366f1;
  uVar18 = *(ulong *)(input + uVar16 + uVar20 + 4) ^ *(ulong *)((long)plVar23 + uVar16);
  uVar13 = 0;
  if (uVar18 != 0) {
    for (; (uVar18 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
    }
  }
  iVar21 = (int)uVar16 + ((uint)(uVar13 >> 3) & 0x1fffffff);
  goto LAB_0023675b;
code_r0x002366f1:
  lVar17 = uVar16 + 8;
  uVar16 = uVar16 + 8;
  if (plVar1 < (long *)((long)plVar23 + lVar17)) goto code_r0x00236704;
  goto LAB_002366e4;
code_r0x00236704:
  plVar23 = (long *)((long)plVar23 + uVar16);
LAB_00236707:
  iVar21 = (int)uVar16;
  if (plVar23 < plVar2) {
    uVar16 = uVar16 & 0xffffffff;
    iVar21 = (iVar21 + iVar4) - (int)plVar23;
    lVar17 = 0;
    do {
      if (input[uVar16 + uVar20 + 4] != *(char *)((long)plVar23 + lVar17)) {
        iVar21 = (int)uVar16;
        break;
      }
      uVar16 = uVar16 + 1;
      lVar17 = lVar17 + 1;
    } while ((long)plVar2 - (long)plVar23 != lVar17);
  }
LAB_0023675b:
  pcVar24 = input + uVar20;
  uVar22 = iVar21 + 4;
  goto LAB_0023686b;
code_r0x0023666c:
  lVar17 = uVar16 + 8;
  uVar16 = uVar16 + 8;
  if (plVar1 < (long *)((long)plVar23 + lVar17)) goto code_r0x0023667f;
  goto LAB_0023665a;
code_r0x0023667f:
  plVar23 = (long *)((long)plVar23 + uVar16);
LAB_00236682:
  iVar21 = (int)uVar16;
  if (plVar23 < plVar2) {
    uVar16 = uVar16 & 0xffffffff;
    iVar21 = (iVar21 + iVar4) - (int)plVar23;
    lVar17 = 0;
    do {
      if (input[uVar16 + uVar20 + 4] != *(char *)((long)plVar23 + lVar17)) {
        iVar21 = (int)uVar16;
        break;
      }
      uVar16 = uVar16 + 1;
      lVar17 = lVar17 + 1;
    } while ((long)plVar2 - (long)plVar23 != lVar17);
  }
LAB_0023676a:
  plVar23 = (long *)((long)plVar26 + 1);
  uVar16 = (ulong)((uint)((ulong)(*(long *)((long)plVar26 + 1) * 0xcf1bbcdcbfa563) >> 0x31) & uVar14
                  );
  pcVar24 = input + *(ushort *)(uVar16 + (long)table2);
  uVar13 = 0;
  plVar7 = plVar23;
  if (plVar23 <= plVar1) {
    uVar13 = 0;
LAB_002367a6:
    if (*(ulong *)((long)plVar23 + uVar13) == *(ulong *)(pcVar24 + uVar13)) goto code_r0x002367b6;
    uVar8 = *(ulong *)(pcVar24 + uVar13) ^ *(ulong *)((long)plVar23 + uVar13);
    uVar18 = 0;
    if (uVar8 != 0) {
      for (; (uVar8 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
      }
    }
    uVar18 = (ulong)((int)uVar13 + ((uint)(uVar18 >> 3) & 0x1fffffff));
    goto LAB_0023683e;
  }
LAB_002367d9:
  uVar12 = (uint)uVar13;
  if (plVar7 < plVar2) {
    uVar13 = uVar13 & 0xffffffff;
    lVar17 = 0;
    do {
      uVar18 = uVar13;
      if (pcVar24[uVar13] != *(char *)((long)plVar7 + lVar17)) break;
      uVar13 = uVar13 + 1;
      lVar17 = lVar17 + 1;
      uVar18 = (ulong)((uVar12 + iVar4) - (int)plVar7);
    } while ((long)plVar2 - (long)plVar7 != lVar17);
LAB_0023683e:
    uVar12 = (uint)uVar18;
  }
  uVar22 = iVar21 + 4;
  if ((ulong)uVar22 < (ulong)(long)(int)uVar12) {
    *(short *)((long)table2 + uVar16) = sVar10;
    plVar26 = plVar23;
    uVar22 = uVar12;
  }
  else {
    pcVar24 = input + uVar20;
  }
LAB_0023686b:
  if ((__src < plVar26) && (input < pcVar24)) {
    while( true ) {
      pcVar19 = pcVar24 + -1;
      plVar23 = (long *)((long)plVar26 + -1);
      if (*(char *)plVar23 != *pcVar19) break;
      uVar22 = uVar22 + 1;
      pcVar24 = pcVar19;
      plVar26 = plVar23;
      if ((plVar23 <= __src) || (pcVar19 <= input)) break;
    }
  }
  sVar10 = (short)plVar26 - (short)input;
  sVar15 = sVar10 + 1;
  *(short *)((ulong)((uint)((ulong)(*(long *)((long)plVar26 + 1) * 0xcf1bbcdcbfa563) >> 0x31) &
                    uVar14) + (long)table2) = sVar15;
  *(short *)((ulong)((uint)((ulong)(*(long *)((long)plVar26 + 2) * 0xcf1bbcdcbfa563) >> 0x31) &
                    uVar14) + (long)table2) = sVar10 + 2;
  *(short *)((ulong)((uint)(*(int *)((long)plVar26 + 1) * -0x61c8864f) >> 0x11 & uVar14) +
            (long)table) = sVar15;
  if (0 < (long)plVar26 - (long)__src) {
    uVar12 = (uint)((long)plVar26 - (long)__src);
    uVar11 = uVar12 - 1;
    if ((int)uVar12 < 0x11) {
      *op = (char)uVar11 << 2;
      lVar17 = __src[1];
      *(long *)((long)op + 1) = *__src;
      *(long *)((long)op + 9) = lVar17;
      op = (char *)((long)op + (long)(int)uVar12 + 1);
    }
    else {
      if (uVar12 < 0x3d) {
        bVar9 = (char)uVar11 << 2;
        puVar25 = (uint *)op;
      }
      else {
        uVar5 = 0x1f;
        if (uVar11 != 0) {
          for (; uVar11 >> uVar5 == 0; uVar5 = uVar5 - 1) {
          }
        }
        uVar5 = (uVar5 ^ 0x18) >> 3 ^ 3;
        *(uint *)((long)op + 1) = uVar11;
        bVar9 = (char)uVar5 * '\x04' | 0xf0;
        puVar25 = (uint *)((long)op + (ulong)uVar5 + 1);
      }
      *op = bVar9;
      op = (char *)((long)puVar25 + (ulong)(uVar12 & 0x7fffffff) + 1);
      puVar25 = (uint *)((long)puVar25 + 1);
      do {
        lVar17 = __src[1];
        *(long *)puVar25 = *__src;
        *(long *)(puVar25 + 2) = lVar17;
        puVar25 = puVar25 + 4;
        __src = __src + 2;
      } while (puVar25 < op);
    }
  }
LAB_00236998:
  uVar16 = (ulong)uVar22;
  uVar13 = (long)plVar26 - (long)pcVar24;
  iVar21 = (int)uVar13;
  if (uVar22 < 0xc) {
    iVar6 = ((uint)(uVar13 >> 3) & 0xe0) - 0xf;
    if (0x7ff < uVar13) {
      iVar6 = -2;
    }
    *(uint *)op = iVar6 + (iVar21 << 8 | uVar22 * 4);
LAB_00236a4c:
    op = (char *)((long)op + (3 - (ulong)(uVar13 < 0x800)));
  }
  else {
    uVar20 = uVar16;
    if (0x43 < uVar22) {
      do {
        *(uint *)op = iVar21 << 8 | 0xfe;
        op = (char *)((long)op + 3);
        uVar20 = uVar20 - 0x40;
      } while (0x43 < uVar20);
    }
    if (0x40 < uVar20) {
      *(uint *)op = iVar21 << 8 | 0xee;
      op = (char *)((long)op + 3);
      uVar20 = uVar20 - 0x3c;
LAB_00236a17:
      iVar6 = ((uint)(uVar13 >> 3) & 0xe0) - 0xf;
      if (0x7ff < uVar13) {
        iVar6 = -2;
      }
      *(int *)op = iVar6 + iVar21 * 0x100 + (int)uVar20 * 4;
      goto LAB_00236a4c;
    }
    if (uVar20 < 0xc) goto LAB_00236a17;
    *(int *)op = iVar21 * 0x100 + -2 + (int)uVar20 * 4;
    op = (char *)((long)op + 3);
  }
  __src = (long *)((long)plVar26 + uVar16);
  if ((long *)((long)plVar2 - 0xfU) <= __src) goto LAB_00236c7f;
  sVar10 = (short)((long)__src - (long)input);
  if (7 < (long)__src - (long)input) {
    *(short *)((ulong)((uint)((ulong)(*(long *)((long)__src + -7) * 0xcf1bbcdcbfa563) >> 0x31) &
                      uVar14) + (long)table2) = sVar10 + -7;
    *(short *)((ulong)((uint)((ulong)(*(long *)((long)__src + -4) * 0xcf1bbcdcbfa563) >> 0x31) &
                      uVar14) + (long)table2) = sVar10 + -4;
  }
  *(short *)((ulong)((uint)((ulong)(*(long *)((long)__src + -3) * 0xcf1bbcdcbfa563) >> 0x31) &
                    uVar14) + (long)table2) = sVar10 + -3;
  *(short *)((ulong)((uint)((ulong)(*(long *)((long)__src + -2) * 0xcf1bbcdcbfa563) >> 0x31) &
                    uVar14) + (long)table2) = sVar10 + -2;
  *(short *)((ulong)((uint)(*(int *)((long)__src + -2) * -0x61c8864f) >> 0x11 & uVar14) +
            (long)table) = sVar10 + -2;
  *(short *)((ulong)((uint)(*(int *)((long)__src + -1) * -0x61c8864f) >> 0x11 & uVar14) +
            (long)table) = sVar10 + -1;
  uVar16 = (ulong)((uint)((ulong)(*__src * 0xcf1bbcdcbfa563) >> 0x31) & uVar14);
  uVar3 = *(ushort *)(uVar16 + (long)table2);
  *(short *)(uVar16 + (long)table2) = sVar10;
  if ((int)*__src != *(int *)(input + uVar3)) {
    uVar16 = (ulong)((uint)((int)*__src * -0x61c8864f) >> 0x11 & uVar14);
    uVar3 = *(ushort *)(uVar16 + (long)table);
    pcVar24 = input + uVar3;
    *(short *)(uVar16 + (long)table) = sVar10;
    if ((int)*__src == *(int *)(input + uVar3)) {
      plVar23 = (long *)((long)__src + 4);
      uVar16 = 0;
      if (plVar23 <= plVar1) {
        uVar16 = 0;
        do {
          uVar13 = *(ulong *)((long)plVar23 + uVar16);
          uVar20 = *(ulong *)(pcVar24 + uVar16 + 4);
          if (uVar13 != uVar20) goto LAB_00236c1b;
          lVar17 = uVar16 + 8;
          uVar16 = uVar16 + 8;
        } while ((long *)((long)plVar23 + lVar17) <= plVar1);
        plVar23 = (long *)((long)plVar23 + uVar16);
      }
      iVar21 = (int)uVar16;
      if (plVar23 < plVar2) {
        uVar16 = uVar16 & 0xffffffff;
        iVar21 = (iVar21 + iVar4) - (int)plVar23;
        lVar17 = 0;
        do {
          if (pcVar24[uVar16 + 4] != *(char *)((long)plVar23 + lVar17)) goto LAB_00236c2a;
          uVar16 = uVar16 + 1;
          lVar17 = lVar17 + 1;
        } while ((long)plVar2 - (long)plVar23 != lVar17);
      }
      goto LAB_00236c31;
    }
    goto LAB_002365d6;
  }
  pcVar24 = input + uVar3;
  plVar23 = (long *)((long)__src + 4);
  uVar16 = 0;
  if (plVar23 <= plVar1) {
    uVar16 = 0;
    do {
      uVar13 = *(ulong *)((long)plVar23 + uVar16);
      uVar20 = *(ulong *)(pcVar24 + uVar16 + 4);
      if (uVar13 != uVar20) goto LAB_00236c1b;
      lVar17 = uVar16 + 8;
      uVar16 = uVar16 + 8;
    } while ((long *)((long)plVar23 + lVar17) <= plVar1);
    plVar23 = (long *)((long)plVar23 + uVar16);
  }
  iVar21 = (int)uVar16;
  if (plVar23 < plVar2) {
    uVar16 = uVar16 & 0xffffffff;
    iVar21 = (iVar21 + iVar4) - (int)plVar23;
    lVar17 = 0;
    do {
      if (pcVar24[uVar16 + 4] != *(char *)((long)plVar23 + lVar17)) goto LAB_00236c2a;
      uVar16 = uVar16 + 1;
      lVar17 = lVar17 + 1;
    } while ((long)plVar2 - (long)plVar23 != lVar17);
  }
LAB_00236c31:
  uVar22 = iVar21 + 4;
  plVar26 = __src;
  goto LAB_00236998;
code_r0x002367b6:
  lVar17 = uVar13 + 8;
  uVar13 = uVar13 + 8;
  if (plVar1 < (long *)((long)plVar23 + lVar17)) goto code_r0x002367cc;
  goto LAB_002367a6;
code_r0x002367cc:
  plVar7 = (long *)(uVar13 + (long)plVar23);
  goto LAB_002367d9;
LAB_00236c1b:
  uVar18 = 0;
  if ((uVar20 ^ uVar13) != 0) {
    for (; ((uVar20 ^ uVar13) >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
    }
  }
  iVar21 = (int)uVar16 + ((uint)(uVar18 >> 3) & 0x1fffffff);
  goto LAB_00236c31;
LAB_00236c2a:
  iVar21 = (int)uVar16;
  goto LAB_00236c31;
}

Assistant:

char* CompressFragmentDoubleHash(const char* input, size_t input_size, char* op,
                                 uint16_t* table, const int table_size,
                                 uint16_t* table2, const int table_size2) {
  (void)table_size2;
  assert(table_size == table_size2);
  // "ip" is the input pointer, and "op" is the output pointer.
  const char* ip = input;
  assert(input_size <= kBlockSize);
  assert((table_size & (table_size - 1)) == 0);  // table must be power of two
  const uint32_t mask = 2 * (table_size - 1);
  const char* ip_end = input + input_size;
  const char* base_ip = ip;

  const size_t kInputMarginBytes = 15;
  if (SNAPPY_PREDICT_TRUE(input_size >= kInputMarginBytes)) {
    const char* ip_limit = input + input_size - kInputMarginBytes;

    for (;;) {
      const char* next_emit = ip++;
      uint64_t data = LittleEndian::Load64(ip);
      uint32_t skip = 512;

      const char* candidate;
      uint32_t candidate_length;
      while (true) {
        assert(static_cast<uint32_t>(data) == LittleEndian::Load32(ip));
        uint16_t* table_entry2 = TableEntry8ByteMatch(table2, data, mask);
        uint32_t bytes_between_hash_lookups = skip >> 9;
        skip++;
        const char* next_ip = ip + bytes_between_hash_lookups;
        if (SNAPPY_PREDICT_FALSE(next_ip > ip_limit)) {
          ip = next_emit;
          goto emit_remainder;
        }
        candidate = base_ip + *table_entry2;
        assert(candidate >= base_ip);
        assert(candidate < ip);

        *table_entry2 = ip - base_ip;
        if (SNAPPY_PREDICT_FALSE(static_cast<uint32_t>(data) ==
                                LittleEndian::Load32(candidate))) {
          candidate_length =
              FindMatchLengthPlain(candidate + 4, ip + 4, ip_end) + 4;
          break;
        }

        uint16_t* table_entry = TableEntry4ByteMatch(table, data, mask);
        candidate = base_ip + *table_entry;
        assert(candidate >= base_ip);
        assert(candidate < ip);

        *table_entry = ip - base_ip;
        if (SNAPPY_PREDICT_FALSE(static_cast<uint32_t>(data) ==
                                LittleEndian::Load32(candidate))) {
          candidate_length =
              FindMatchLengthPlain(candidate + 4, ip + 4, ip_end) + 4;
          table_entry2 =
              TableEntry8ByteMatch(table2, LittleEndian::Load64(ip + 1), mask);
          auto candidate2 = base_ip + *table_entry2;
          size_t candidate_length2 =
              FindMatchLengthPlain(candidate2, ip + 1, ip_end);
          if (candidate_length2 > candidate_length) {
            *table_entry2 = ip - base_ip;
            candidate = candidate2;
            candidate_length = candidate_length2;
            ++ip;
          }
          break;
        }
        data = LittleEndian::Load64(next_ip);
        ip = next_ip;
      }
      // Backtrack to the point it matches fully.
      while (ip > next_emit && candidate > base_ip &&
             *(ip - 1) == *(candidate - 1)) {
        --ip;
        --candidate;
        ++candidate_length;
      }
      *TableEntry8ByteMatch(table2, LittleEndian::Load64(ip + 1), mask) =
          ip - base_ip + 1;
      *TableEntry8ByteMatch(table2, LittleEndian::Load64(ip + 2), mask) =
          ip - base_ip + 2;
      *TableEntry4ByteMatch(table, LittleEndian::Load32(ip + 1), mask) =
          ip - base_ip + 1;
      // Step 2: A 4-byte or 8-byte match has been found.
      // We'll later see if more than 4 bytes match.  But, prior to the match,
      // input bytes [next_emit, ip) are unmatched.  Emit them as
      // "literal bytes."
      assert(next_emit + 16 <= ip_end);
      if (ip - next_emit > 0) {
        op = EmitLiteral</*allow_fast_path=*/true>(op, next_emit,
                                                   ip - next_emit);
      }
      // Step 3: Call EmitCopy, and then see if another EmitCopy could
      // be our next move.  Repeat until we find no match for the
      // input immediately after what was consumed by the last EmitCopy call.
      //
      // If we exit this loop normally then we need to call EmitLiteral next,
      // though we don't yet know how big the literal will be.  We handle that
      // by proceeding to the next iteration of the main loop.  We also can exit
      // this loop via goto if we get close to exhausting the input.
      do {
        // We have a 4-byte match at ip, and no need to emit any
        // "literal bytes" prior to ip.
        const char* base = ip;
        ip += candidate_length;
        size_t offset = base - candidate;
        if (candidate_length < 12) {
          op =
              EmitCopy</*len_less_than_12=*/true>(op, offset, candidate_length);
        } else {
          op = EmitCopy</*len_less_than_12=*/false>(op, offset,
                                                    candidate_length);
        }
        if (SNAPPY_PREDICT_FALSE(ip >= ip_limit)) {
          goto emit_remainder;
        }
        // We are now looking for a 4-byte match again.  We read
        // table[Hash(ip, mask)] for that. To improve compression,
        // we also update several previous table entries.
        if (ip - base_ip > 7) {
          *TableEntry8ByteMatch(table2, LittleEndian::Load64(ip - 7), mask) =
              ip - base_ip - 7;
          *TableEntry8ByteMatch(table2, LittleEndian::Load64(ip - 4), mask) =
              ip - base_ip - 4;
        }
        *TableEntry8ByteMatch(table2, LittleEndian::Load64(ip - 3), mask) =
            ip - base_ip - 3;
        *TableEntry8ByteMatch(table2, LittleEndian::Load64(ip - 2), mask) =
            ip - base_ip - 2;
        *TableEntry4ByteMatch(table, LittleEndian::Load32(ip - 2), mask) =
            ip - base_ip - 2;
        *TableEntry4ByteMatch(table, LittleEndian::Load32(ip - 1), mask) =
            ip - base_ip - 1;

        uint16_t* table_entry =
            TableEntry8ByteMatch(table2, LittleEndian::Load64(ip), mask);
        candidate = base_ip + *table_entry;
        *table_entry = ip - base_ip;
        if (LittleEndian::Load32(ip) == LittleEndian::Load32(candidate)) {
          candidate_length =
              FindMatchLengthPlain(candidate + 4, ip + 4, ip_end) + 4;
          continue;
        }
        table_entry =
            TableEntry4ByteMatch(table, LittleEndian::Load32(ip), mask);
        candidate = base_ip + *table_entry;
        *table_entry = ip - base_ip;
        if (LittleEndian::Load32(ip) == LittleEndian::Load32(candidate)) {
          candidate_length =
              FindMatchLengthPlain(candidate + 4, ip + 4, ip_end) + 4;
          continue;
        }
        break;
      } while (true);
    }
  }

emit_remainder:
  // Emit the remaining bytes as a literal
  if (ip < ip_end) {
    op = EmitLiteral</*allow_fast_path=*/false>(op, ip, ip_end - ip);
  }

  return op;
}